

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdiSubWindowPrivate::ensureWindowState(QMdiSubWindowPrivate *this,WindowState state)

{
  QWidget *this_00;
  bool bVar1;
  WindowStates WVar2;
  QFlagsStorage<Qt::WindowState> newstate;
  QFlagsStorage<Qt::WindowState> newstate_00;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  WVar2 = QWidget::windowState(this_00);
  newstate.i = (uint)WVar2.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                     super_QFlagsStorage<Qt::WindowState>.i | state;
  if (state == WindowNoState) {
    newstate.i = newstate.i & ~(WindowFullScreen|WindowMaximized|WindowMinimized);
  }
  else if (state == WindowMaximized) {
    newstate.i = newstate.i & ~(WindowFullScreen|WindowMinimized);
  }
  else if (state == WindowMinimized) {
    newstate.i = newstate.i & ~(WindowFullScreen|WindowMaximized);
  }
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->baseWidget);
  if (bVar1) {
    WVar2 = QWidget::windowState((QWidget *)(this->baseWidget).wp.value);
    newstate_00.i = newstate.i & 0xfffffff7;
    if (((uint)WVar2.super_QFlagsStorageHelper<Qt::WindowState,_4>.
               super_QFlagsStorage<Qt::WindowState>.i & 8) != 0) {
      newstate_00.i = newstate.i;
    }
    QWidget::overrideWindowState((QWidget *)(this->baseWidget).wp.value,(WindowStates)newstate_00.i)
    ;
  }
  QWidget::overrideWindowState(this_00,(WindowStates)newstate.i);
  return;
}

Assistant:

void QMdiSubWindowPrivate::ensureWindowState(Qt::WindowState state)
{
    Q_Q(QMdiSubWindow);
    Qt::WindowStates windowStates = q->windowState() | state;
    switch (state) {
    case Qt::WindowMinimized:
        windowStates &= ~Qt::WindowMaximized;
        windowStates &= ~Qt::WindowFullScreen;
        windowStates &= ~Qt::WindowNoState;
        break;
    case Qt::WindowMaximized:
        windowStates &= ~Qt::WindowMinimized;
        windowStates &= ~Qt::WindowFullScreen;
        windowStates &= ~Qt::WindowNoState;
        break;
    case Qt::WindowNoState:
        windowStates &= ~Qt::WindowMinimized;
        windowStates &= ~Qt::WindowMaximized;
        windowStates &= ~Qt::WindowFullScreen;
        break;
    default:
        break;
    }
    if (baseWidget) {
        if (!(baseWidget->windowState() & Qt::WindowActive) && windowStates & Qt::WindowActive)
            baseWidget->overrideWindowState(windowStates & ~Qt::WindowActive);
        else
            baseWidget->overrideWindowState(windowStates);
    }
    q->overrideWindowState(windowStates);
}